

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsystemtrayicon.cpp
# Opt level: O1

void QSystemTrayIcon::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QArrayData *pQVar7;
  QIcon QVar8;
  MessageIcon msgIcon;
  QIcon *pQVar9;
  QString *pQVar10;
  undefined1 visible;
  QString *pQVar11;
  QSystemTrayIconPrivate *pQVar12;
  int iVar13;
  long in_FS_OFFSET;
  QIcon moved;
  QIcon local_50;
  QIcon local_48;
  QIcon *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    pQStack_40 = &local_50;
    local_50.d._0_4_ = *_a[1];
    pQVar9 = &local_48;
    local_48.d = (QIconPrivate *)0x0;
    iVar13 = 0;
    goto LAB_00390ad6;
  case 1:
    iVar13 = 1;
    pQVar9 = (QIcon *)0x0;
LAB_00390ad6:
    QMetaObject::activate(_o,&staticMetaObject,iVar13,&pQVar9->d);
    break;
  case 2:
    visible = *_a[1];
    goto LAB_00390a9e;
  case 3:
    visible = true;
LAB_00390a9e:
    setVisible((QSystemTrayIcon *)_o,(bool)visible);
    break;
  case 4:
    pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
    if (pQVar12->visible != false) {
      pQVar12->visible = false;
      QSystemTrayIconPrivate::remove_sys(pQVar12);
    }
    break;
  case 5:
    pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
    if (pQVar12->visible == true) {
      iVar13 = *_a[4];
      pQVar9 = (QIcon *)_a[3];
      pQVar11 = (QString *)_a[1];
      pQVar10 = (QString *)_a[2];
LAB_00390b24:
      QSystemTrayIconPrivate::showMessage_sys(pQVar12,pQVar11,pQVar10,pQVar9,NoIcon,iVar13);
    }
    break;
  case 6:
    pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
    if (pQVar12->visible == true) {
      pQVar9 = (QIcon *)_a[3];
      pQVar11 = (QString *)_a[1];
      pQVar10 = (QString *)_a[2];
      iVar13 = 10000;
      goto LAB_00390b24;
    }
    break;
  case 7:
    pQVar11 = (QString *)_a[1];
    pQVar10 = (QString *)_a[2];
    msgIcon = *_a[3];
    iVar13 = *_a[4];
    goto LAB_00390b53;
  case 8:
    pQVar11 = (QString *)_a[1];
    pQVar10 = (QString *)_a[2];
    msgIcon = *_a[3];
    goto LAB_00390b4d;
  case 9:
    pQVar11 = (QString *)_a[1];
    pQVar10 = (QString *)_a[2];
    msgIcon = Information;
LAB_00390b4d:
    iVar13 = 10000;
LAB_00390b53:
    showMessage((QSystemTrayIcon *)_o,pQVar11,pQVar10,msgIcon,iVar13);
    break;
  case 10:
    QSystemTrayIconPrivate::_q_emitActivated(*(QSystemTrayIconPrivate **)(_o + 8),*_a[1]);
  }
  if (_c == ReadProperty) {
switchD_003909fc_caseD_1:
    puVar2 = (undefined8 *)*_a;
    if (_id == 2) {
      *(undefined1 *)puVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0xb8);
    }
    else if (_id == 1) {
      QIcon::QIcon(&local_50,(QIcon *)(*(long *)(_o + 8) + 0x88));
      QVar8.d = local_50.d;
      local_50.d = (QIconPrivate *)0x0;
      local_48.d = (QIconPrivate *)*puVar2;
      *puVar2 = QVar8.d;
      QIcon::~QIcon(&local_48);
      QIcon::~QIcon(&local_50);
    }
    else if (_id == 0) {
      lVar3 = *(long *)(_o + 8);
      piVar4 = *(int **)(lVar3 + 0x90);
      uVar5 = *(undefined8 *)(lVar3 + 0x98);
      uVar6 = *(undefined8 *)(lVar3 + 0xa0);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      pQVar7 = (QArrayData *)*puVar2;
      *puVar2 = piVar4;
      puVar2[1] = uVar5;
      puVar2[2] = uVar6;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
    }
    if (_c != WriteProperty) goto switchD_003909fc_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_003909fc_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == activated) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003909fc_caseD_3;
    }
    if (((code *)*plVar1 == messageClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003909fc_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_003909fc_caseD_3;
      goto switchD_003909fc_caseD_1;
    }
  }
  pQVar9 = (QIcon *)*_a;
  if (_id == 2) {
    setVisible((QSystemTrayIcon *)_o,*(bool *)&pQVar9->d);
  }
  else if (_id == 1) {
    pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
    QIcon::operator=(&pQVar12->icon,pQVar9);
    QSystemTrayIconPrivate::updateIcon_sys(pQVar12);
  }
  else if (_id == 0) {
    pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
    QString::operator=(&pQVar12->toolTip,(QString *)pQVar9);
    QSystemTrayIconPrivate::updateToolTip_sys(pQVar12);
  }
switchD_003909fc_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIcon::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSystemTrayIcon *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        case 1: _t->messageClicked(); break;
        case 2: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->show(); break;
        case 4: _t->hide(); break;
        case 5: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 6: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3]))); break;
        case 7: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 8: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3]))); break;
        case 9: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 10: _t->d_func()->_q_emitActivated((*reinterpret_cast< std::add_pointer_t<QPlatformSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)(QSystemTrayIcon::ActivationReason )>(_a, &QSystemTrayIcon::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)()>(_a, &QSystemTrayIcon::messageClicked, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}